

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack4to1.h
# Opt level: O1

void ncnn::conv3x3s1_winograd63_pack4to1_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int _c;
  size_t sVar6;
  int *piVar7;
  int _h;
  int _w;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  int iVar55;
  long lVar56;
  int iVar57;
  long lVar58;
  Mat *pMVar59;
  Option *opt_00;
  long lVar60;
  void *pvVar61;
  undefined4 *puVar62;
  uint uVar63;
  int iVar64;
  ulong uVar65;
  undefined8 *puVar66;
  int iVar67;
  float *pfVar68;
  void *pvVar69;
  long lVar70;
  float *pfVar71;
  undefined8 *puVar72;
  float *pfVar73;
  long lVar74;
  float *pfVar75;
  int iVar76;
  long lVar77;
  ulong uVar78;
  void *pvVar79;
  ulong uVar80;
  undefined4 *puVar81;
  void *pvVar82;
  void *pvVar83;
  void *pvVar84;
  uint uVar85;
  void *pvVar86;
  uint uVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  void *local_330;
  undefined8 *local_328;
  void *local_300;
  void *local_2f8;
  long local_2f0;
  void *local_2e8;
  void *local_2e0;
  void *local_2d8;
  void *local_2d0;
  Mat local_2c8;
  Mat local_278;
  Mat *local_228;
  long local_220;
  Mat local_218;
  Mat local_1c8;
  Mat *local_180;
  long local_178;
  void *local_170;
  void *local_168;
  void *local_160;
  void *local_158;
  void *local_150;
  void *local_148;
  void *local_140;
  undefined8 *local_138;
  long local_130;
  long local_128;
  void *local_120;
  undefined8 local_118;
  undefined1 local_110 [8];
  undefined8 local_108;
  long local_100;
  undefined1 local_f8 [8];
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  float local_e8;
  undefined8 uStack_e4;
  float fStack_dc;
  Allocator *local_d8;
  int iStack_d0;
  int iStack_cc;
  int iStack_c8;
  int iStack_c4;
  int local_c0;
  size_t local_b8 [4];
  float afStack_98 [8];
  float afStack_78 [8];
  float afStack_58 [8];
  float afStack_38 [2];
  
  iVar57 = bottom_blob->c;
  sVar6 = bottom_blob->elemsize;
  iVar64 = bottom_blob->elempack;
  iVar67 = top_blob->w;
  iVar76 = top_blob->h;
  _c = top_blob->c;
  local_1c8.data = bottom_blob->data;
  piVar7 = bottom_blob->refcount;
  local_1c8.refcount._0_4_ = SUB84(piVar7,0);
  local_1c8.refcount._4_4_ = (undefined4)((ulong)piVar7 >> 0x20);
  local_1c8.elemsize._0_4_ = (undefined4)sVar6;
  local_1c8.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
  local_1c8.allocator = bottom_blob->allocator;
  uVar47 = bottom_blob->dims;
  uVar48 = bottom_blob->w;
  uVar49 = bottom_blob->h;
  uVar50 = bottom_blob->d;
  local_1c8.cstep = bottom_blob->cstep;
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + 1;
    UNLOCK();
  }
  iVar67 = (iVar67 + 5) / 6;
  _w = iVar67 * 6;
  iVar76 = (iVar76 + 5) / 6;
  _h = iVar76 * 6;
  local_228 = bias;
  local_1c8.elempack = iVar64;
  local_1c8.dims = uVar47;
  local_1c8.w = uVar48;
  local_1c8.h = uVar49;
  local_1c8.d = uVar50;
  local_1c8.c = iVar57;
  local_180 = top_blob;
  copy_make_border(bottom_blob,&local_1c8,0,(_h - bottom_blob->h) + 2,0,(_w - bottom_blob->w) + 2,0,
                   0.0,opt);
  local_2c8.cstep = 0;
  uVar63 = iVar67 * 8 * iVar76 >> 3;
  local_2c8.data = (void *)0x0;
  local_2c8.refcount._0_4_ = 0;
  local_2c8.refcount._4_4_ = 0;
  local_2c8.elemsize._0_4_ = 0;
  local_2c8._20_8_ = 0;
  local_2c8.allocator = (Allocator *)0x0;
  local_2c8.dims = 0;
  local_2c8.w = 0;
  local_2c8.h = 0;
  local_2c8.d = 0;
  local_2c8.c = 0;
  Mat::create(&local_2c8,uVar63,0x40,iVar57,sVar6,iVar64,opt->workspace_allocator);
  conv3x3s1_winograd63_transform_input_pack4_sse(&local_1c8,&local_2c8,opt_00);
  piVar7 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_1c8.allocator == (Allocator *)0x0) {
        if (local_1c8.data != (void *)0x0) {
          free(local_1c8.data);
        }
      }
      else {
        (*(local_1c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_1c8.cstep = 0;
  local_1c8.data = (void *)0x0;
  local_1c8.refcount._0_4_ = 0;
  local_1c8.refcount._4_4_ = 0;
  local_1c8.elemsize._0_4_ = 0;
  local_1c8.elemsize._4_4_ = 0;
  local_1c8.elempack = 0;
  local_1c8.h = 0;
  local_1c8.d = 0;
  local_1c8.c = 0;
  local_1c8.allocator = (Allocator *)0x0;
  local_1c8.dims = 0;
  local_1c8.w = 0;
  local_218.cstep = 0;
  local_218.data = (void *)0x0;
  local_218.refcount._0_4_ = 0;
  local_218.refcount._4_4_ = 0;
  local_218.elemsize._0_4_ = 0;
  local_218.elemsize._4_4_ = 0;
  local_218.elempack = 0;
  local_218.allocator = (Allocator *)0x0;
  local_218.dims = 0;
  local_218.w = 0;
  local_218.h = 0;
  local_218.d = 0;
  local_218.c = 0;
  local_b8[0] = 0;
  local_f8 = (undefined1  [8])0x0;
  uStack_f0 = 0;
  uStack_ec = 0;
  local_e8 = 0.0;
  uStack_e4._0_4_ = 0;
  uStack_e4._4_4_ = 0;
  local_d8 = (Allocator *)0x0;
  iStack_d0 = 0;
  iStack_cc = 0;
  iStack_c8 = 0;
  iStack_c4 = 0;
  local_c0 = 0;
  if ((int)uVar63 < 8) {
    uVar87 = uVar63;
    iVar67 = iVar57;
    if (3 < (int)uVar63) {
      iVar67 = iVar57 * 4;
      uVar87 = (uVar63 & 3) + 1;
    }
  }
  else {
    uVar87 = (uVar63 & 3) + (uVar63 >> 3) + (uint)((uVar63 >> 2 & 1) != 0);
    iVar67 = iVar57 * 8;
  }
  Mat::create((Mat *)local_f8,iVar67,uVar87,0x40,sVar6,iVar64,opt->workspace_allocator);
  lVar56 = (long)(int)uVar63;
  lVar58 = 0;
  do {
    lVar74 = CONCAT44((undefined4)uStack_e4,local_e8);
    lVar60 = local_b8[0] * lVar58 * lVar74;
    lVar70 = (long)iStack_cc;
    uVar80 = 0;
    if (7 < (int)uVar63) {
      uVar78 = 0;
      do {
        if (0 < iVar57) {
          puVar81 = (undefined4 *)
                    ((ulong)((uVar63 * (int)lVar58 + (int)uVar78) * 4) * 4 + (long)local_2c8.data);
          puVar62 = (undefined4 *)((long)local_f8 + (uVar78 >> 3) * lVar74 * lVar70 + lVar60);
          iVar64 = iVar57;
          do {
            uVar8 = puVar81[1];
            uVar9 = puVar81[2];
            uVar10 = puVar81[3];
            uVar11 = puVar81[4];
            uVar12 = puVar81[5];
            uVar13 = puVar81[6];
            uVar14 = puVar81[7];
            uVar15 = puVar81[8];
            uVar16 = puVar81[9];
            uVar17 = puVar81[10];
            uVar18 = puVar81[0xb];
            uVar19 = puVar81[0xc];
            uVar20 = puVar81[0xd];
            uVar21 = puVar81[0xe];
            uVar22 = puVar81[0xf];
            uVar23 = puVar81[0x10];
            uVar24 = puVar81[0x11];
            uVar25 = puVar81[0x12];
            uVar26 = puVar81[0x13];
            uVar27 = puVar81[0x14];
            uVar28 = puVar81[0x15];
            uVar29 = puVar81[0x16];
            uVar30 = puVar81[0x17];
            uVar31 = puVar81[0x18];
            uVar32 = puVar81[0x19];
            uVar33 = puVar81[0x1a];
            uVar34 = puVar81[0x1b];
            uVar35 = puVar81[0x1c];
            uVar36 = puVar81[0x1d];
            uVar37 = puVar81[0x1e];
            uVar38 = puVar81[0x1f];
            *puVar62 = *puVar81;
            puVar62[1] = uVar11;
            puVar62[2] = uVar15;
            puVar62[3] = uVar19;
            puVar62[4] = uVar23;
            puVar62[5] = uVar27;
            puVar62[6] = uVar31;
            puVar62[7] = uVar35;
            puVar62[8] = uVar8;
            puVar62[9] = uVar12;
            puVar62[10] = uVar16;
            puVar62[0xb] = uVar20;
            puVar62[0xc] = uVar24;
            puVar62[0xd] = uVar28;
            puVar62[0xe] = uVar32;
            puVar62[0xf] = uVar36;
            puVar62[0x10] = uVar9;
            puVar62[0x11] = uVar13;
            puVar62[0x12] = uVar17;
            puVar62[0x13] = uVar21;
            puVar62[0x14] = uVar25;
            puVar62[0x15] = uVar29;
            puVar62[0x16] = uVar33;
            puVar62[0x17] = uVar37;
            puVar62[0x18] = uVar10;
            puVar62[0x19] = uVar14;
            puVar62[0x1a] = uVar18;
            puVar62[0x1b] = uVar22;
            puVar62[0x1c] = uVar26;
            puVar62[0x1d] = uVar30;
            puVar62[0x1e] = uVar34;
            puVar62[0x1f] = uVar38;
            puVar81 = puVar81 + local_2c8.cstep * 4;
            puVar62 = puVar62 + 0x20;
            iVar64 = iVar64 + -1;
          } while (iVar64 != 0);
        }
        uVar80 = uVar78 + 8;
        lVar77 = uVar78 + 0xf;
        uVar78 = uVar80;
      } while (lVar77 < lVar56);
    }
    if ((int)((uint)uVar80 | 3) < (int)uVar63) {
      uVar78 = uVar80 & 0xffffffff;
      do {
        if (0 < iVar57) {
          puVar81 = (undefined4 *)((uVar78 + lVar58 * lVar56) * 0x10 + (long)local_2c8.data);
          puVar62 = (undefined4 *)
                    ((long)local_f8 +
                    (ulong)(((uint)(uVar78 >> 3) & 0x1fffffff) +
                           (uint)(((uint)uVar78 >> 2 & 1) != 0)) * lVar74 * lVar70 + lVar60);
          iVar64 = iVar57;
          do {
            uVar8 = puVar81[1];
            uVar9 = puVar81[2];
            uVar10 = puVar81[3];
            uVar11 = puVar81[4];
            uVar12 = puVar81[5];
            uVar13 = puVar81[6];
            uVar14 = puVar81[7];
            uVar15 = puVar81[8];
            uVar16 = puVar81[9];
            uVar17 = puVar81[10];
            uVar18 = puVar81[0xb];
            uVar19 = puVar81[0xc];
            uVar20 = puVar81[0xd];
            uVar21 = puVar81[0xe];
            uVar22 = puVar81[0xf];
            *puVar62 = *puVar81;
            puVar62[1] = uVar11;
            puVar62[2] = uVar15;
            puVar62[3] = uVar19;
            puVar62[4] = uVar8;
            puVar62[5] = uVar12;
            puVar62[6] = uVar16;
            puVar62[7] = uVar20;
            puVar62[8] = uVar9;
            puVar62[9] = uVar13;
            puVar62[10] = uVar17;
            puVar62[0xb] = uVar21;
            puVar62[0xc] = uVar10;
            puVar62[0xd] = uVar14;
            puVar62[0xe] = uVar18;
            puVar62[0xf] = uVar22;
            puVar81 = puVar81 + local_2c8.cstep * 4;
            puVar62 = puVar62 + 0x10;
            iVar64 = iVar64 + -1;
          } while (iVar64 != 0);
        }
        uVar80 = uVar78 + 4;
        lVar77 = uVar78 + 7;
        uVar78 = uVar80;
      } while (lVar77 < lVar56);
    }
    if ((int)uVar80 < (int)uVar63) {
      uVar80 = uVar80 & 0xffffffff;
      do {
        if (0 < iVar57) {
          puVar62 = (undefined4 *)((uVar80 + lVar58 * lVar56) * 0x10 + (long)local_2c8.data);
          puVar81 = (undefined4 *)
                    ((long)local_f8 +
                    (ulong)(((uint)(uVar80 >> 3) & 0x1fffffff) + ((uint)uVar80 & 3) +
                           (uint)(((uint)uVar80 >> 2 & 1) != 0)) * lVar74 * lVar70 + lVar60);
          iVar64 = iVar57;
          do {
            uVar8 = puVar62[1];
            uVar9 = puVar62[2];
            uVar10 = puVar62[3];
            *puVar81 = *puVar62;
            puVar81[1] = uVar8;
            puVar81[2] = uVar9;
            puVar81[3] = uVar10;
            puVar62 = puVar62 + local_2c8.cstep * 4;
            puVar81 = puVar81 + 4;
            iVar64 = iVar64 + -1;
          } while (iVar64 != 0);
        }
        uVar80 = uVar80 + 1;
      } while (uVar80 != uVar63);
    }
    lVar58 = lVar58 + 1;
  } while (lVar58 != 0x40);
  piVar7 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_2c8.allocator == (Allocator *)0x0) {
        if (local_2c8.data != (void *)0x0) {
          free(local_2c8.data);
        }
      }
      else {
        (*(local_2c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_2c8.cstep = 0;
  local_2c8.data = (void *)0x0;
  local_2c8.refcount._0_4_ = 0;
  local_2c8.refcount._4_4_ = 0;
  local_2c8.elemsize._0_4_ = 0;
  local_2c8._20_8_ = 0;
  local_2c8.h = 0;
  local_2c8.d = 0;
  local_2c8.c = 0;
  local_2c8.allocator = (Allocator *)0x0;
  local_2c8.dims = 0;
  local_2c8.w = 0;
  Mat::create(&local_218,uVar63,0x40,_c,4,1,opt->workspace_allocator);
  pMVar59 = local_180;
  if (0 < _c >> 2) {
    iVar64 = 1;
    if (1 < iVar57 * 4) {
      iVar64 = iVar57 * 4;
    }
    uVar80 = 0;
    do {
      lVar58 = CONCAT44(local_218.elemsize._4_4_,(undefined4)local_218.elemsize);
      pfVar68 = (float *)(uVar80 * 4 * local_218.cstep * lVar58 + (long)local_218.data);
      pfVar71 = (float *)((uVar80 * 4 + 1) * local_218.cstep * lVar58 + (long)local_218.data);
      pfVar73 = (float *)((uVar80 * 4 + 2) * local_218.cstep * lVar58 + (long)local_218.data);
      pfVar75 = (float *)((uVar80 * 4 + 3) * local_218.cstep * lVar58 + (long)local_218.data);
      iVar67 = kernel_tm->w;
      sVar6 = kernel_tm->elemsize;
      pvVar82 = (void *)(sVar6 * kernel_tm->cstep * uVar80 + (long)kernel_tm->data);
      lVar58 = 0;
      do {
        uVar78 = 0;
        lVar60 = (long)iStack_cc;
        lVar74 = CONCAT44((undefined4)uStack_e4,local_e8);
        if (7 < (int)uVar63) {
          pvVar61 = (void *)(local_b8[0] * lVar74 * lVar58 + (long)local_f8);
          uVar65 = 0;
          do {
            if (iVar57 < 1) {
              fVar112 = 0.0;
              fVar113 = 0.0;
              fVar114 = 0.0;
              fVar115 = 0.0;
              fVar116 = 0.0;
              fVar117 = 0.0;
              fVar118 = 0.0;
              fVar119 = 0.0;
              fVar108 = 0.0;
              fVar109 = 0.0;
              fVar110 = 0.0;
              fVar111 = 0.0;
              fVar100 = 0.0;
              fVar101 = 0.0;
              fVar102 = 0.0;
              fVar103 = 0.0;
              fVar96 = 0.0;
              fVar97 = 0.0;
              fVar98 = 0.0;
              fVar99 = 0.0;
              fVar92 = 0.0;
              fVar93 = 0.0;
              fVar94 = 0.0;
              fVar95 = 0.0;
              fVar88 = 0.0;
              fVar89 = 0.0;
              fVar90 = 0.0;
              fVar91 = 0.0;
              fVar104 = 0.0;
              fVar105 = 0.0;
              fVar106 = 0.0;
              fVar107 = 0.0;
            }
            else {
              fVar104 = 0.0;
              fVar105 = 0.0;
              fVar106 = 0.0;
              fVar107 = 0.0;
              lVar70 = 0;
              fVar88 = 0.0;
              fVar89 = 0.0;
              fVar90 = 0.0;
              fVar91 = 0.0;
              fVar92 = 0.0;
              fVar93 = 0.0;
              fVar94 = 0.0;
              fVar95 = 0.0;
              fVar96 = 0.0;
              fVar97 = 0.0;
              fVar98 = 0.0;
              fVar99 = 0.0;
              fVar100 = 0.0;
              fVar101 = 0.0;
              fVar102 = 0.0;
              fVar103 = 0.0;
              fVar108 = 0.0;
              fVar109 = 0.0;
              fVar110 = 0.0;
              fVar111 = 0.0;
              fVar116 = 0.0;
              fVar117 = 0.0;
              fVar118 = 0.0;
              fVar119 = 0.0;
              fVar112 = 0.0;
              fVar113 = 0.0;
              fVar114 = 0.0;
              fVar115 = 0.0;
              iVar76 = iVar64;
              do {
                pfVar1 = (float *)((long)pvVar61 + lVar70 * 2);
                fVar39 = *pfVar1;
                fVar40 = pfVar1[1];
                fVar41 = pfVar1[2];
                fVar42 = pfVar1[3];
                pfVar1 = (float *)((long)pvVar61 + lVar70 * 2 + 0x10);
                fVar43 = *pfVar1;
                fVar44 = pfVar1[1];
                fVar45 = pfVar1[2];
                fVar46 = pfVar1[3];
                fVar2 = *(float *)((long)pvVar82 + lVar70);
                fVar3 = *(float *)((long)pvVar82 + lVar70 + 4);
                fVar4 = *(float *)((long)pvVar82 + lVar70 + 8);
                fVar5 = *(float *)((long)pvVar82 + lVar70 + 0xc);
                fVar104 = fVar104 + fVar2 * fVar39;
                fVar105 = fVar105 + fVar2 * fVar40;
                fVar106 = fVar106 + fVar2 * fVar41;
                fVar107 = fVar107 + fVar2 * fVar42;
                fVar112 = fVar112 + fVar2 * fVar43;
                fVar113 = fVar113 + fVar2 * fVar44;
                fVar114 = fVar114 + fVar2 * fVar45;
                fVar115 = fVar115 + fVar2 * fVar46;
                fVar116 = fVar116 + fVar3 * fVar39;
                fVar117 = fVar117 + fVar3 * fVar40;
                fVar118 = fVar118 + fVar3 * fVar41;
                fVar119 = fVar119 + fVar3 * fVar42;
                fVar108 = fVar108 + fVar3 * fVar43;
                fVar109 = fVar109 + fVar3 * fVar44;
                fVar110 = fVar110 + fVar3 * fVar45;
                fVar111 = fVar111 + fVar3 * fVar46;
                fVar100 = fVar100 + fVar4 * fVar39;
                fVar101 = fVar101 + fVar4 * fVar40;
                fVar102 = fVar102 + fVar4 * fVar41;
                fVar103 = fVar103 + fVar4 * fVar42;
                fVar96 = fVar96 + fVar4 * fVar43;
                fVar97 = fVar97 + fVar4 * fVar44;
                fVar98 = fVar98 + fVar4 * fVar45;
                fVar99 = fVar99 + fVar4 * fVar46;
                fVar92 = fVar92 + fVar39 * fVar5;
                fVar93 = fVar93 + fVar40 * fVar5;
                fVar94 = fVar94 + fVar41 * fVar5;
                fVar95 = fVar95 + fVar42 * fVar5;
                fVar88 = fVar88 + fVar5 * fVar43;
                fVar89 = fVar89 + fVar5 * fVar44;
                fVar90 = fVar90 + fVar5 * fVar45;
                fVar91 = fVar91 + fVar5 * fVar46;
                lVar70 = lVar70 + 0x10;
                iVar76 = iVar76 + -1;
              } while (iVar76 != 0);
            }
            *pfVar68 = fVar104;
            pfVar68[1] = fVar105;
            pfVar68[2] = fVar106;
            pfVar68[3] = fVar107;
            pfVar68[4] = fVar112;
            pfVar68[5] = fVar113;
            pfVar68[6] = fVar114;
            pfVar68[7] = fVar115;
            *pfVar71 = fVar116;
            pfVar71[1] = fVar117;
            pfVar71[2] = fVar118;
            pfVar71[3] = fVar119;
            pfVar71[4] = fVar108;
            pfVar71[5] = fVar109;
            pfVar71[6] = fVar110;
            pfVar71[7] = fVar111;
            *pfVar73 = fVar100;
            pfVar73[1] = fVar101;
            pfVar73[2] = fVar102;
            pfVar73[3] = fVar103;
            pfVar73[4] = fVar96;
            pfVar73[5] = fVar97;
            pfVar73[6] = fVar98;
            pfVar73[7] = fVar99;
            *pfVar75 = fVar92;
            pfVar75[1] = fVar93;
            pfVar75[2] = fVar94;
            pfVar75[3] = fVar95;
            pfVar75[4] = fVar88;
            pfVar75[5] = fVar89;
            pfVar75[6] = fVar90;
            pfVar75[7] = fVar91;
            pfVar68 = pfVar68 + 8;
            pfVar71 = pfVar71 + 8;
            pfVar73 = pfVar73 + 8;
            pfVar75 = pfVar75 + 8;
            uVar78 = uVar65 + 8;
            lVar70 = uVar65 + 0xf;
            pvVar61 = (void *)((long)pvVar61 + lVar74 * lVar60);
            uVar65 = uVar78;
          } while (lVar70 < lVar56);
        }
        uVar87 = (uint)uVar78;
        if ((int)(uVar87 | 3) < (int)uVar63) {
          uVar85 = 0;
          do {
            iVar76 = (int)uVar78;
            if (iVar57 < 1) {
              fVar96 = 0.0;
              fVar97 = 0.0;
              fVar98 = 0.0;
              fVar99 = 0.0;
              fVar100 = 0.0;
              fVar101 = 0.0;
              fVar102 = 0.0;
              fVar103 = 0.0;
              fVar92 = 0.0;
              fVar93 = 0.0;
              fVar94 = 0.0;
              fVar95 = 0.0;
              fVar88 = 0.0;
              fVar89 = 0.0;
              fVar90 = 0.0;
              fVar91 = 0.0;
            }
            else {
              fVar88 = 0.0;
              fVar89 = 0.0;
              fVar90 = 0.0;
              fVar91 = 0.0;
              lVar70 = 0;
              fVar92 = 0.0;
              fVar93 = 0.0;
              fVar94 = 0.0;
              fVar95 = 0.0;
              fVar100 = 0.0;
              fVar101 = 0.0;
              fVar102 = 0.0;
              fVar103 = 0.0;
              fVar96 = 0.0;
              fVar97 = 0.0;
              fVar98 = 0.0;
              fVar99 = 0.0;
              iVar55 = iVar64;
              do {
                pfVar1 = (float *)((long)local_f8 +
                                  lVar70 + ((ulong)((uVar85 & 1) +
                                                   ((uint)(uVar78 >> 3) & 0x1fffffff)) * lVar60 +
                                           local_b8[0] * lVar58) * lVar74);
                fVar108 = *pfVar1;
                fVar109 = pfVar1[1];
                fVar110 = pfVar1[2];
                fVar111 = pfVar1[3];
                fVar104 = *(float *)((long)pvVar82 + lVar70);
                fVar105 = *(float *)((long)pvVar82 + lVar70 + 4);
                fVar106 = *(float *)((long)pvVar82 + lVar70 + 8);
                fVar107 = *(float *)((long)pvVar82 + lVar70 + 0xc);
                fVar96 = fVar96 + fVar104 * fVar108;
                fVar97 = fVar97 + fVar104 * fVar109;
                fVar98 = fVar98 + fVar104 * fVar110;
                fVar99 = fVar99 + fVar104 * fVar111;
                fVar100 = fVar100 + fVar105 * fVar108;
                fVar101 = fVar101 + fVar105 * fVar109;
                fVar102 = fVar102 + fVar105 * fVar110;
                fVar103 = fVar103 + fVar105 * fVar111;
                fVar92 = fVar92 + fVar106 * fVar108;
                fVar93 = fVar93 + fVar106 * fVar109;
                fVar94 = fVar94 + fVar106 * fVar110;
                fVar95 = fVar95 + fVar106 * fVar111;
                fVar88 = fVar88 + fVar107 * fVar108;
                fVar89 = fVar89 + fVar107 * fVar109;
                fVar90 = fVar90 + fVar107 * fVar110;
                fVar91 = fVar91 + fVar107 * fVar111;
                lVar70 = lVar70 + 0x10;
                iVar55 = iVar55 + -1;
              } while (iVar55 != 0);
            }
            *pfVar68 = fVar96;
            pfVar68[1] = fVar97;
            pfVar68[2] = fVar98;
            pfVar68[3] = fVar99;
            *pfVar71 = fVar100;
            pfVar71[1] = fVar101;
            pfVar71[2] = fVar102;
            pfVar71[3] = fVar103;
            *pfVar73 = fVar92;
            pfVar73[1] = fVar93;
            pfVar73[2] = fVar94;
            pfVar73[3] = fVar95;
            *pfVar75 = fVar88;
            pfVar75[1] = fVar89;
            pfVar75[2] = fVar90;
            pfVar75[3] = fVar91;
            pfVar68 = pfVar68 + 4;
            pfVar71 = pfVar71 + 4;
            pfVar73 = pfVar73 + 4;
            pfVar75 = pfVar75 + 4;
            uVar87 = iVar76 + 4;
            uVar85 = (uint)(byte)((char)uVar85 + 1);
            uVar78 = (ulong)uVar87;
          } while (iVar76 + 7 < (int)uVar63);
        }
        if ((int)uVar87 < (int)uVar63) {
          do {
            if (iVar57 < 1) {
              fVar88 = 0.0;
              fVar89 = 0.0;
              fVar90 = 0.0;
              fVar91 = 0.0;
            }
            else {
              fVar88 = 0.0;
              fVar89 = 0.0;
              fVar90 = 0.0;
              fVar91 = 0.0;
              lVar70 = 0;
              iVar76 = iVar64;
              do {
                fVar92 = *(float *)((long)local_f8 +
                                   lVar70 + ((ulong)((uVar87 & 3) + (uVar87 >> 3) +
                                                    (uint)((uVar87 >> 2 & 1) != 0)) * lVar60 +
                                            local_b8[0] * lVar58) * lVar74);
                pfVar1 = (float *)((long)pvVar82 + lVar70 * 4);
                fVar88 = fVar88 + fVar92 * *pfVar1;
                fVar89 = fVar89 + fVar92 * pfVar1[1];
                fVar90 = fVar90 + fVar92 * pfVar1[2];
                fVar91 = fVar91 + fVar92 * pfVar1[3];
                lVar70 = lVar70 + 4;
                iVar76 = iVar76 + -1;
              } while (iVar76 != 0);
            }
            *pfVar68 = fVar88;
            *pfVar71 = fVar89;
            *pfVar73 = fVar90;
            *pfVar75 = fVar91;
            pfVar68 = pfVar68 + 1;
            pfVar71 = pfVar71 + 1;
            pfVar73 = pfVar73 + 1;
            pfVar75 = pfVar75 + 1;
            uVar87 = uVar87 + 1;
          } while (uVar87 != uVar63);
        }
        lVar58 = lVar58 + 1;
        pvVar82 = (void *)((long)pvVar82 + (long)iVar67 * sVar6);
      } while (lVar58 != 0x40);
      uVar80 = uVar80 + 1;
    } while (uVar80 != (uint)(_c >> 2));
  }
  uVar80 = (long)_c & 0xfffffffffffffffc;
  if ((int)uVar80 != _c) {
    iVar64 = 1;
    if (1 < iVar57 * 4) {
      iVar64 = iVar57 * 4;
    }
    do {
      pfVar68 = (float *)(local_218.cstep * uVar80 *
                          CONCAT44(local_218.elemsize._4_4_,(undefined4)local_218.elemsize) +
                         (long)local_218.data);
      uVar87 = (uint)uVar80;
      uVar85 = uVar87 + 3;
      if (-1 < (int)uVar87) {
        uVar85 = uVar87;
      }
      iVar67 = kernel_tm->w;
      sVar6 = kernel_tm->elemsize;
      pvVar82 = (void *)((long)(int)(((int)uVar85 >> 2) + (uVar87 - (uVar85 & 0xfffffffc))) *
                         kernel_tm->cstep * sVar6 + (long)kernel_tm->data);
      lVar58 = 0;
      do {
        lVar74 = CONCAT44((undefined4)uStack_e4,local_e8);
        lVar70 = local_b8[0] * lVar58 * lVar74;
        uVar78 = 0;
        lVar60 = (long)iStack_cc;
        if (7 < (int)uVar63) {
          uVar65 = 0;
          do {
            if (iVar57 < 1) {
              fVar92 = 0.0;
              fVar93 = 0.0;
              fVar94 = 0.0;
              fVar95 = 0.0;
              fVar88 = 0.0;
              fVar89 = 0.0;
              fVar90 = 0.0;
              fVar91 = 0.0;
            }
            else {
              pfVar71 = (float *)((long)local_f8 + (uVar65 >> 3) * lVar74 * lVar60 + lVar70);
              fVar88 = 0.0;
              fVar89 = 0.0;
              fVar90 = 0.0;
              fVar91 = 0.0;
              lVar77 = 0;
              fVar92 = 0.0;
              fVar93 = 0.0;
              fVar94 = 0.0;
              fVar95 = 0.0;
              do {
                fVar96 = *(float *)((long)pvVar82 + lVar77 * 4);
                fVar92 = fVar92 + *pfVar71 * fVar96;
                fVar93 = fVar93 + pfVar71[1] * fVar96;
                fVar94 = fVar94 + pfVar71[2] * fVar96;
                fVar95 = fVar95 + pfVar71[3] * fVar96;
                fVar88 = fVar88 + fVar96 * pfVar71[4];
                fVar89 = fVar89 + fVar96 * pfVar71[5];
                fVar90 = fVar90 + fVar96 * pfVar71[6];
                fVar91 = fVar91 + fVar96 * pfVar71[7];
                lVar77 = lVar77 + 1;
                pfVar71 = pfVar71 + 8;
              } while (iVar64 != (int)lVar77);
            }
            *pfVar68 = fVar92;
            pfVar68[1] = fVar93;
            pfVar68[2] = fVar94;
            pfVar68[3] = fVar95;
            pfVar68[4] = fVar88;
            pfVar68[5] = fVar89;
            pfVar68[6] = fVar90;
            pfVar68[7] = fVar91;
            pfVar68 = pfVar68 + 8;
            uVar78 = uVar65 + 8;
            lVar77 = uVar65 + 0xf;
            uVar65 = uVar78;
          } while (lVar77 < lVar56);
        }
        uVar87 = (uint)uVar78;
        if ((int)(uVar87 | 3) < (int)uVar63) {
          do {
            uVar85 = (uint)uVar78;
            if (iVar57 < 1) {
              fVar88 = 0.0;
              fVar89 = 0.0;
              fVar90 = 0.0;
              fVar91 = 0.0;
            }
            else {
              pfVar71 = (float *)((long)local_f8 +
                                 (ulong)(((uint)(uVar78 >> 3) & 0x1fffffff) +
                                        (uint)((uVar85 >> 2 & 1) != 0)) * lVar74 * lVar60 + lVar70);
              fVar88 = 0.0;
              fVar89 = 0.0;
              fVar90 = 0.0;
              fVar91 = 0.0;
              lVar77 = 0;
              do {
                fVar92 = *(float *)((long)pvVar82 + lVar77 * 4);
                fVar88 = fVar88 + fVar92 * *pfVar71;
                fVar89 = fVar89 + fVar92 * pfVar71[1];
                fVar90 = fVar90 + fVar92 * pfVar71[2];
                fVar91 = fVar91 + fVar92 * pfVar71[3];
                pfVar71 = pfVar71 + 4;
                lVar77 = lVar77 + 1;
              } while (iVar64 != (int)lVar77);
            }
            *pfVar68 = fVar88;
            pfVar68[1] = fVar89;
            pfVar68[2] = fVar90;
            pfVar68[3] = fVar91;
            pfVar68 = pfVar68 + 4;
            uVar87 = uVar85 + 4;
            uVar78 = (ulong)uVar87;
          } while ((int)(uVar85 + 7) < (int)uVar63);
        }
        if ((int)uVar87 < (int)uVar63) {
          do {
            if (iVar57 < 1) {
              fVar88 = 0.0;
              fVar89 = 0.0;
              fVar90 = 0.0;
              fVar91 = 0.0;
            }
            else {
              fVar88 = 0.0;
              fVar89 = 0.0;
              fVar90 = 0.0;
              fVar91 = 0.0;
              lVar70 = 0;
              iVar76 = iVar57;
              do {
                pfVar71 = (float *)((long)pvVar82 + lVar70);
                pfVar73 = (float *)((long)local_f8 +
                                   lVar70 + ((ulong)((uVar87 & 3) + (uVar87 >> 3) +
                                                    (uint)((uVar87 >> 2 & 1) != 0)) * lVar60 +
                                            local_b8[0] * lVar58) * lVar74);
                fVar88 = fVar88 + *pfVar71 * *pfVar73;
                fVar89 = fVar89 + pfVar71[1] * pfVar73[1];
                fVar90 = fVar90 + pfVar71[2] * pfVar73[2];
                fVar91 = fVar91 + pfVar71[3] * pfVar73[3];
                lVar70 = lVar70 + 0x10;
                iVar76 = iVar76 + -1;
              } while (iVar76 != 0);
            }
            *pfVar68 = fVar91 + fVar89 + fVar90 + fVar88;
            pfVar68 = pfVar68 + 1;
            uVar87 = uVar87 + 1;
          } while (uVar87 != uVar63);
        }
        lVar58 = lVar58 + 1;
        pvVar82 = (void *)((long)pvVar82 + (long)iVar67 * sVar6);
      } while (lVar58 != 0x40);
      uVar80 = uVar80 + 1;
    } while ((long)uVar80 < (long)_c);
  }
  piVar7 = (int *)CONCAT44(uStack_ec,uStack_f0);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_d8 == (Allocator *)0x0) {
        if (local_f8 != (undefined1  [8])0x0) {
          free((void *)local_f8);
        }
      }
      else {
        (*local_d8->_vptr_Allocator[3])();
      }
    }
  }
  local_b8[0] = 0;
  local_f8 = (undefined1  [8])0x0;
  uStack_f0 = 0;
  uStack_ec = 0;
  local_e8 = 0.0;
  uStack_e4._0_4_ = 0;
  uStack_e4._4_4_ = 0;
  iStack_d0 = 0;
  iStack_cc = 0;
  iStack_c8 = 0;
  iStack_c4 = 0;
  local_c0 = 0;
  piVar7 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_2c8.allocator == (Allocator *)0x0) {
        if (local_2c8.data != (void *)0x0) {
          free(local_2c8.data);
        }
      }
      else {
        (*(local_2c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_2c8.cstep = 0;
  local_2c8.data = (void *)0x0;
  local_2c8.refcount._0_4_ = 0;
  local_2c8.refcount._4_4_ = 0;
  local_2c8.elemsize._0_4_ = 0;
  local_2c8._20_8_ = 0;
  local_2c8.h = 0;
  local_2c8.d = 0;
  local_2c8.c = 0;
  local_2c8.allocator = (Allocator *)0x0;
  local_2c8.dims = 0;
  local_2c8.w = 0;
  local_278.cstep = 0;
  local_278.data = (void *)0x0;
  local_278.refcount._0_4_ = 0;
  local_278.refcount._4_4_ = 0;
  local_278.elemsize._0_4_ = 0;
  local_278.elemsize._4_4_ = 0;
  local_278.elempack = 0;
  local_278.allocator = (Allocator *)0x0;
  local_278.dims = 0;
  local_278.w = 0;
  local_278.h = 0;
  local_278.d = 0;
  local_278.c = 0;
  if ((_w == pMVar59->w) && (_h == pMVar59->h)) {
    if (&local_278 != pMVar59) {
      piVar7 = pMVar59->refcount;
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + 1;
        UNLOCK();
      }
      local_2c8.cstep = 0;
      local_2c8.c = 0;
      local_2c8.d = 0;
      local_2c8.h = 0;
      local_2c8.w = 0;
      local_2c8.dims = 0;
      local_2c8.allocator = (Allocator *)0x0;
      local_2c8._20_8_ = 0;
      local_2c8.elemsize._0_4_ = 0;
      local_2c8.refcount._4_4_ = 0;
      local_2c8.refcount._0_4_ = 0;
      local_2c8.data = (void *)0x0;
      local_278.data = pMVar59->data;
      local_278.refcount._0_4_ = SUB84(pMVar59->refcount,0);
      local_278.refcount._4_4_ = (undefined4)((ulong)pMVar59->refcount >> 0x20);
      local_278.elemsize._0_4_ = (undefined4)pMVar59->elemsize;
      local_278.elemsize._4_4_ = (undefined4)(pMVar59->elemsize >> 0x20);
      local_278.elempack = pMVar59->elempack;
      local_278.allocator = pMVar59->allocator;
      uVar51 = pMVar59->dims;
      uVar52 = pMVar59->w;
      uVar53 = pMVar59->h;
      uVar54 = pMVar59->d;
      local_278.c = pMVar59->c;
      local_278.cstep = pMVar59->cstep;
      local_278.dims = uVar51;
      local_278.w = uVar52;
      local_278.h = uVar53;
      local_278.d = uVar54;
    }
  }
  else {
    Mat::create(&local_278,_w,_h,_c,4,1,opt->workspace_allocator);
  }
  local_220 = (long)local_278.w;
  local_118 = (long)local_278.c;
  if (0 < local_118) {
    local_120 = local_228->data;
    local_228 = (Mat *)(ulong)(uint)(local_278.h / 6);
    uVar63 = local_278.w / 6;
    iVar57 = (local_278.h / 6) * uVar63;
    local_128 = CONCAT44(local_218.elemsize._4_4_,(undefined4)local_218.elemsize) * local_218.cstep;
    local_140 = (void *)((long)local_218.data + (long)iVar57 * 4);
    local_148 = (void *)((long)local_218.data + (long)(iVar57 * 2) * 4);
    local_150 = (void *)((long)local_218.data + (long)(iVar57 * 3) * 4);
    local_158 = (void *)((long)local_218.data + (long)(iVar57 * 4) * 4);
    local_160 = (void *)((long)local_218.data + (long)(iVar57 * 5) * 4);
    local_168 = (void *)((long)local_218.data + (long)(iVar57 * 6) * 4);
    local_170 = (void *)((long)local_218.data + (long)(iVar57 * 7) * 4);
    local_138 = (undefined8 *)((long)local_278.data + 0x10);
    local_130 = local_278.cstep * CONCAT44(local_278.elemsize._4_4_,(undefined4)local_278.elemsize);
    local_100 = CONCAT44(local_278.elemsize._4_4_,(undefined4)local_278.elemsize) * local_220 * 6;
    local_108 = (ulong)uVar63 * 4;
    local_178 = 0;
    lVar56 = 0;
    do {
      local_110 = (undefined1  [8])lVar56;
      if (local_120 == (void *)0x0) {
        fVar88 = 0.0;
      }
      else {
        fVar88 = *(float *)((long)local_120 + (long)local_110 * 4);
      }
      if (5 < local_278.h) {
        local_328 = local_138;
        local_2f8 = local_170;
        local_2d0 = local_168;
        local_2d8 = local_160;
        local_300 = local_158;
        local_2e0 = local_150;
        local_330 = local_148;
        local_2e8 = local_140;
        local_2f0 = local_178;
        pMVar59 = (Mat *)0x0;
        do {
          if (5 < local_278.w) {
            uVar80 = 0;
            pvVar82 = local_2d0;
            pvVar61 = local_2f8;
            pvVar69 = local_2e8;
            puVar72 = local_328;
            lVar56 = local_2f0;
            pvVar79 = local_2e0;
            pvVar83 = local_300;
            pvVar84 = local_330;
            pvVar86 = local_2d8;
            do {
              lVar58 = -0x20;
              lVar74 = 0;
              do {
                fVar92 = *(float *)((long)pvVar84 + lVar74) + *(float *)((long)pvVar69 + lVar74);
                fVar89 = *(float *)((long)pvVar69 + lVar74) - *(float *)((long)pvVar84 + lVar74);
                fVar93 = *(float *)((long)pvVar83 + lVar74) + *(float *)((long)pvVar79 + lVar74);
                fVar90 = *(float *)((long)pvVar79 + lVar74) - *(float *)((long)pvVar83 + lVar74);
                fVar94 = *(float *)((long)pvVar82 + lVar74) + *(float *)((long)pvVar86 + lVar74);
                fVar91 = *(float *)((long)pvVar86 + lVar74) - *(float *)((long)pvVar82 + lVar74);
                *(float *)((long)&local_d8 + lVar58) =
                     fVar93 + fVar92 + *(float *)((long)local_218.data + lVar74 + lVar56) +
                     fVar94 * 32.0;
                *(float *)((long)afStack_98 + lVar58) = fVar94 * 8.0 + fVar93 * 4.0 + fVar92;
                *(float *)((long)afStack_58 + lVar58) = fVar94 + fVar94 + fVar92 + fVar93 * 16.0;
                *(float *)((long)local_b8 + lVar58) = fVar90 + fVar90 + fVar89 + fVar91 * 16.0;
                *(float *)((long)afStack_78 + lVar58) = fVar91 * 4.0 + fVar90 * 8.0 + fVar89;
                *(float *)((long)afStack_38 + lVar58) =
                     fVar90 * 32.0 + fVar89 + fVar91 + *(float *)((long)pvVar61 + lVar74);
                lVar74 = lVar74 + (long)(iVar57 * 8) * 4;
                lVar58 = lVar58 + 4;
              } while (lVar58 != 0);
              lVar58 = 0x1c;
              puVar66 = puVar72;
              do {
                fVar89 = *(float *)((long)&local_108 + lVar58 + 4);
                fVar91 = (float)*(undefined8 *)((long)&local_100 + lVar58);
                fVar92 = (float)((ulong)*(undefined8 *)((long)&local_100 + lVar58) >> 0x20);
                fVar90 = fVar92 + fVar91;
                fVar91 = fVar91 - fVar92;
                fVar93 = (float)*(undefined8 *)(local_110 + lVar58 + 4);
                fVar94 = (float)((ulong)*(undefined8 *)(local_110 + lVar58 + 4) >> 0x20);
                fVar92 = fVar89 + fVar94;
                fVar95 = *(float *)(local_110 + lVar58) + fVar88 + fVar93;
                fVar94 = fVar94 - fVar89;
                fVar89 = fVar88 + (*(float *)(local_110 + lVar58) - fVar93);
                *(float *)(puVar66 + -2) =
                     fVar90 * 32.0 + fVar95 + fVar92 + *(float *)((long)&local_118 + lVar58 + 4);
                *(float *)((long)puVar66 + -0xc) = fVar91 * 16.0 + fVar89 + fVar94 + fVar94;
                *(float *)(puVar66 + -1) = fVar90 * 8.0 + fVar95 + fVar92 * 4.0;
                *(float *)((long)puVar66 + -4) = fVar91 * 4.0 + fVar94 * 8.0 + fVar89;
                *puVar66 = CONCAT44(*(float *)(local_f8 + lVar58) + fVar91 + fVar89 + fVar94 * 32.0,
                                    fVar92 * 16.0 + fVar95 + fVar90 + fVar90);
                lVar58 = lVar58 + 0x20;
                puVar66 = (undefined8 *)((long)puVar66 + local_220 * 4);
              } while (lVar58 != 0xdc);
              uVar80 = uVar80 + 1;
              lVar56 = lVar56 + 4;
              pvVar69 = (void *)((long)pvVar69 + 4);
              pvVar84 = (void *)((long)pvVar84 + 4);
              pvVar79 = (void *)((long)pvVar79 + 4);
              pvVar83 = (void *)((long)pvVar83 + 4);
              pvVar86 = (void *)((long)pvVar86 + 4);
              pvVar82 = (void *)((long)pvVar82 + 4);
              pvVar61 = (void *)((long)pvVar61 + 4);
              puVar72 = puVar72 + 3;
            } while (uVar80 != uVar63);
          }
          pMVar59 = (Mat *)((long)&pMVar59->data + 1);
          local_2f0 = local_2f0 + local_108;
          local_2e8 = (void *)((long)local_2e8 + local_108);
          local_330 = (void *)((long)local_330 + local_108);
          local_2e0 = (void *)((long)local_2e0 + local_108);
          local_300 = (void *)((long)local_300 + local_108);
          local_2d8 = (void *)((long)local_2d8 + local_108);
          local_2d0 = (void *)((long)local_2d0 + local_108);
          local_2f8 = (void *)((long)local_2f8 + local_108);
          local_328 = (undefined8 *)((long)local_328 + local_100);
        } while (pMVar59 != local_228);
      }
      local_178 = local_178 + local_128;
      local_140 = (void *)((long)local_140 + local_128);
      local_148 = (void *)((long)local_148 + local_128);
      local_150 = (void *)((long)local_150 + local_128);
      local_158 = (void *)((long)local_158 + local_128);
      local_160 = (void *)((long)local_160 + local_128);
      local_168 = (void *)((long)local_168 + local_128);
      local_170 = (void *)((long)local_170 + local_128);
      local_138 = (undefined8 *)((long)local_138 + local_130);
      lVar56 = (long)local_110 + 1;
    } while ((long)local_110 + 1 != local_118);
  }
  copy_cut_border(&local_278,local_180,0,local_278.h - local_180->h,0,local_278.w - local_180->w,opt
                 );
  piVar7 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_278.allocator == (Allocator *)0x0) {
        if (local_278.data != (void *)0x0) {
          free(local_278.data);
        }
      }
      else {
        (*(local_278.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_278.cstep = 0;
  local_278.data = (void *)0x0;
  local_278.refcount._0_4_ = 0;
  local_278.refcount._4_4_ = 0;
  local_278.elemsize._0_4_ = 0;
  local_278.elemsize._4_4_ = 0;
  local_278.elempack = 0;
  local_278.dims = 0;
  local_278.w = 0;
  local_278.h = 0;
  local_278.d = 0;
  local_278.c = 0;
  piVar7 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_218.allocator == (Allocator *)0x0) {
        if (local_218.data != (void *)0x0) {
          free(local_218.data);
        }
      }
      else {
        (*(local_218.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_218.cstep = 0;
  local_218.data = (void *)0x0;
  local_218.refcount._0_4_ = 0;
  local_218.refcount._4_4_ = 0;
  local_218.elemsize._0_4_ = 0;
  local_218.elemsize._4_4_ = 0;
  local_218.elempack = 0;
  local_218.dims = 0;
  local_218.w = 0;
  local_218.h = 0;
  local_218.d = 0;
  local_218.c = 0;
  piVar7 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_2c8.allocator == (Allocator *)0x0) {
        if (local_2c8.data != (void *)0x0) {
          free(local_2c8.data);
        }
      }
      else {
        (*(local_2c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_2c8.cstep = 0;
  local_2c8.data = (void *)0x0;
  local_2c8.refcount._0_4_ = 0;
  local_2c8.refcount._4_4_ = 0;
  local_2c8.elemsize._0_4_ = 0;
  local_2c8._20_8_ = 0;
  local_2c8.dims = 0;
  local_2c8.w = 0;
  local_2c8.h = 0;
  local_2c8.d = 0;
  local_2c8.c = 0;
  piVar7 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_1c8.allocator == (Allocator *)0x0) {
        if (local_1c8.data != (void *)0x0) {
          free(local_1c8.data);
        }
      }
      else {
        (*(local_1c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_pack4to1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 6n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 5) / 6 * 6;
    outh = (outh + 5) / 6 * 6;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tm = outw / 6 * 8;
        int h_tm = outh / 6 * 8;

        const int tiles = w_tm / 8 * h_tm / 8;

        bottom_blob_tm.create(tiles, 64, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd63_transform_input_pack4_sse(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 6 * 8;
        int h_tm = outh / 6 * 8;

        const int tiles = h_tm / 8 * w_tm / 8;

        // permute
        //         bottom_blob_tm.create(tiles, 64, inch, elemsize, elempack, opt.workspace_allocator);
        Mat bottom_blob_tm2;
        if (tiles >= 8)
            bottom_blob_tm2.create(8 * inch, tiles / 8 + (tiles % 8) / 4 + tiles % 4, 64, elemsize, elempack, opt.workspace_allocator);
        else if (tiles >= 4)
            bottom_blob_tm2.create(4 * inch, tiles / 4 + tiles % 4, 64, elemsize, elempack, opt.workspace_allocator);
        else // if (tiles >= 1)
            bottom_blob_tm2.create(1 * inch, tiles, 64, elemsize, elempack, opt.workspace_allocator);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int r = 0; r < 64; r++)
        {
            Mat tm2 = bottom_blob_tm2.channel(r);

            // tile
            int i = 0;
            for (; i + 7 < tiles; i += 8)
            {
                float* tmpptr = tm2.row(i / 8);

                const float* r0 = bottom_blob_tm;

                r0 += (r * tiles + i) * 4;

                for (int q = 0; q < inch; q++)
                {
                    // transpose 4x8
                    __m128 _r0 = _mm_load_ps(r0);
                    __m128 _r1 = _mm_load_ps(r0 + 4);
                    __m128 _r2 = _mm_load_ps(r0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(r0 + 4 * 3);
                    __m128 _r4 = _mm_load_ps(r0 + 4 * 4);
                    __m128 _r5 = _mm_load_ps(r0 + 4 * 5);
                    __m128 _r6 = _mm_load_ps(r0 + 4 * 6);
                    __m128 _r7 = _mm_load_ps(r0 + 4 * 7);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r4);
                    _mm_store_ps(tmpptr + 4 * 2, _r1);
                    _mm_store_ps(tmpptr + 4 * 3, _r5);
                    _mm_store_ps(tmpptr + 4 * 4, _r2);
                    _mm_store_ps(tmpptr + 4 * 5, _r6);
                    _mm_store_ps(tmpptr + 4 * 6, _r3);
                    _mm_store_ps(tmpptr + 4 * 7, _r7);

                    r0 += bottom_blob_tm.cstep * 4;
                    tmpptr += 32;
                }
            }
            for (; i + 3 < tiles; i += 4)
            {
                float* tmpptr = tm2.row(i / 8 + (i % 8) / 4);

                const float* r0 = bottom_blob_tm;

                r0 += (r * tiles + i) * 4;

                for (int q = 0; q < inch; q++)
                {
                    // transpose 4x4
                    __m128 _r0 = _mm_load_ps(r0);
                    __m128 _r1 = _mm_load_ps(r0 + 4);
                    __m128 _r2 = _mm_load_ps(r0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(r0 + 4 * 3);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r1);
                    _mm_store_ps(tmpptr + 4 * 2, _r2);
                    _mm_store_ps(tmpptr + 4 * 3, _r3);

                    r0 += bottom_blob_tm.cstep * 4;
                    tmpptr += 16;
                }
            }
            for (; i < tiles; i++)
            {
                float* tmpptr = tm2.row(i / 8 + (i % 8) / 4 + i % 4);

                const float* r0 = bottom_blob_tm;

                r0 += (r * tiles + i) * 4;

                for (int q = 0; q < inch; q++)
                {
                    __m128 _val = _mm_load_ps(r0);
                    _mm_store_ps(tmpptr, _val);

                    r0 += bottom_blob_tm.cstep * 4;
                    tmpptr += 4;
                }
            }
        }

        bottom_blob_tm = Mat();
        // permute end

        top_blob_tm.create(tiles, 64, outch, 4u, 1, opt.workspace_allocator);

        int nn_outch = outch >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int p = pp * 4;

            float* output0_tm = top_blob_tm.channel(p);
            float* output1_tm = top_blob_tm.channel(p + 1);
            float* output2_tm = top_blob_tm.channel(p + 2);
            float* output3_tm = top_blob_tm.channel(p + 3);

            const Mat kernel01_tm = kernel_tm.channel(p / 4);

            for (int r = 0; r < 64; r++)
            {
                const Mat bb2 = bottom_blob_tm2.channel(r);

                int i = 0;
                for (; i + 7 < tiles; i += 8)
                {
                    const float* r0 = bb2.row(i / 8);

                    const float* kptr = kernel01_tm.row(r);

                    int nn = inch * 4; // inch always > 0

                    __m128 _sum0 = _mm_setzero_ps();
                    __m128 _sum1 = _mm_setzero_ps();
                    __m128 _sum2 = _mm_setzero_ps();
                    __m128 _sum3 = _mm_setzero_ps();
                    __m128 _sum4 = _mm_setzero_ps();
                    __m128 _sum5 = _mm_setzero_ps();
                    __m128 _sum6 = _mm_setzero_ps();
                    __m128 _sum7 = _mm_setzero_ps();

                    for (int j = 0; j < nn; j++)
                    {
                        __m128 _val0 = _mm_load_ps(r0);
                        __m128 _val1 = _mm_load_ps(r0 + 4);

                        __m128 _w0 = _mm_load1_ps(kptr);
                        __m128 _w1 = _mm_load1_ps(kptr + 1);
                        __m128 _w2 = _mm_load1_ps(kptr + 2);
                        __m128 _w3 = _mm_load1_ps(kptr + 3);

                        _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                        _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                        _sum2 = _mm_comp_fmadd_ps(_val0, _w1, _sum2);
                        _sum3 = _mm_comp_fmadd_ps(_val1, _w1, _sum3);
                        _sum4 = _mm_comp_fmadd_ps(_val0, _w2, _sum4);
                        _sum5 = _mm_comp_fmadd_ps(_val1, _w2, _sum5);
                        _sum6 = _mm_comp_fmadd_ps(_val0, _w3, _sum6);
                        _sum7 = _mm_comp_fmadd_ps(_val1, _w3, _sum7);

                        r0 += 8;
                        kptr += 4;
                    }

                    _mm_storeu_ps(output0_tm, _sum0);
                    _mm_storeu_ps(output0_tm + 4, _sum1);
                    _mm_storeu_ps(output1_tm, _sum2);
                    _mm_storeu_ps(output1_tm + 4, _sum3);
                    _mm_storeu_ps(output2_tm, _sum4);
                    _mm_storeu_ps(output2_tm + 4, _sum5);
                    _mm_storeu_ps(output3_tm, _sum6);
                    _mm_storeu_ps(output3_tm + 4, _sum7);

                    output0_tm += 8;
                    output1_tm += 8;
                    output2_tm += 8;
                    output3_tm += 8;
                }
                for (; i + 3 < tiles; i += 4)
                {
                    const float* r0 = bb2.row(i / 8 + (i % 8) / 4);

                    const float* kptr = kernel01_tm.row(r);

                    int nn = inch * 4; // inch always > 0

                    __m128 _sum0 = _mm_setzero_ps();
                    __m128 _sum1 = _mm_setzero_ps();
                    __m128 _sum2 = _mm_setzero_ps();
                    __m128 _sum3 = _mm_setzero_ps();

                    for (int j = 0; j < nn; j++)
                    {
                        __m128 _val0 = _mm_load_ps(r0);

                        __m128 _w0 = _mm_load1_ps(kptr);
                        __m128 _w1 = _mm_load1_ps(kptr + 1);
                        __m128 _w2 = _mm_load1_ps(kptr + 2);
                        __m128 _w3 = _mm_load1_ps(kptr + 3);

                        _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                        _sum1 = _mm_comp_fmadd_ps(_val0, _w1, _sum1);
                        _sum2 = _mm_comp_fmadd_ps(_val0, _w2, _sum2);
                        _sum3 = _mm_comp_fmadd_ps(_val0, _w3, _sum3);

                        r0 += 4;
                        kptr += 4;
                    }

                    _mm_storeu_ps(output0_tm, _sum0);
                    _mm_storeu_ps(output1_tm, _sum1);
                    _mm_storeu_ps(output2_tm, _sum2);
                    _mm_storeu_ps(output3_tm, _sum3);

                    output0_tm += 4;
                    output1_tm += 4;
                    output2_tm += 4;
                    output3_tm += 4;
                }
                for (; i < tiles; i++)
                {
                    const float* r0 = bb2.row(i / 8 + (i % 8) / 4 + i % 4);

                    const float* kptr = kernel01_tm.row(r);

                    int nn = inch * 4; // inch always > 0

                    __m128 _sum = _mm_setzero_ps();

                    for (int j = 0; j < nn; j++)
                    {
                        __m128 _val0 = _mm_load1_ps(r0);
                        __m128 _w0 = _mm_load_ps(kptr);
                        _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);

                        r0 += 1;
                        kptr += 4;
                    }

                    float sum[4];
                    _mm_storeu_ps(sum, _sum);

                    output0_tm[0] = sum[0];
                    output1_tm[0] = sum[1];
                    output2_tm[0] = sum[2];
                    output3_tm[0] = sum[3];

                    output0_tm += 1;
                    output1_tm += 1;
                    output2_tm += 1;
                    output3_tm += 1;
                }
            }
        }

        int remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = remain_outch_start; p < outch; p++)
        {
            float* output0_tm = top_blob_tm.channel(p);

            const Mat kernel0_tm = kernel_tm.channel(p / 4 + p % 4);

            for (int r = 0; r < 64; r++)
            {
                const Mat bb2 = bottom_blob_tm2.channel(r);

                int i = 0;
                for (; i + 7 < tiles; i += 8)
                {
                    const float* r0 = bb2.row(i / 8);

                    const float* kptr = kernel0_tm.row(r);

                    int nn = inch * 4; // inch always > 0

                    __m128 _sum0 = _mm_setzero_ps();
                    __m128 _sum1 = _mm_setzero_ps();

                    for (int j = 0; j < nn; j++)
                    {
                        __m128 _val0 = _mm_load_ps(r0);
                        __m128 _val1 = _mm_load_ps(r0 + 4);
                        __m128 _w0 = _mm_load1_ps(kptr);
                        _sum0 = _mm_comp_fmadd_ps(_w0, _val0, _sum0);
                        _sum1 = _mm_comp_fmadd_ps(_w0, _val1, _sum1);

                        r0 += 8;
                        kptr += 1;
                    }

                    _mm_storeu_ps(output0_tm, _sum0);
                    _mm_storeu_ps(output0_tm + 4, _sum1);

                    output0_tm += 8;
                }
                for (; i + 3 < tiles; i += 4)
                {
                    const float* r0 = bb2.row(i / 8 + (i % 8) / 4);

                    const float* kptr = kernel0_tm.row(r);

                    int nn = inch * 4; // inch always > 0

                    __m128 _sum0 = _mm_setzero_ps();

                    for (int j = 0; j < nn; j++)
                    {
                        __m128 _val0 = _mm_load_ps(r0);
                        __m128 _w0 = _mm_load1_ps(kptr);
                        _sum0 = _mm_comp_fmadd_ps(_w0, _val0, _sum0);

                        r0 += 4;
                        kptr += 1;
                    }

                    _mm_storeu_ps(output0_tm, _sum0);

                    output0_tm += 4;
                }
                for (; i < tiles; i++)
                {
                    const float* r0 = bb2.row(i / 8 + (i % 8) / 4 + i % 4);

                    const float* kptr = kernel0_tm.row(r);

                    __m128 _sum0 = _mm_setzero_ps();

                    for (int q = 0; q < inch; q++)
                    {
                        __m128 _val0 = _mm_load_ps(r0);
                        __m128 _w0 = _mm_load_ps(kptr);
                        _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);

                        r0 += 4;
                        kptr += 4;
                    }

                    float sum0 = _mm_reduce_add_ps(_sum0);

                    output0_tm[0] = sum0;

                    output0_tm++;
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, 4u, 1, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd63_transform_output_sse(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}